

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array(Array<kj::ArrayPtr<const_capnp::word>_> *this)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  size_t sVar2;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (ArrayPtr<const_capnp::word> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (ArrayPtr<const_capnp::word> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }